

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckEmptyLines.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckEmptyLines(Parser *this,unsigned_long max,bool checkEndOfFile)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  byte bVar9;
  bool bVar10;
  Error error;
  string line;
  value_type local_98;
  Parser *local_60;
  size_type local_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  this->m_TestsDone[0x15] = true;
  __s = (char *)operator_new__(0xff);
  snprintf(__s,0xff,"Empty lines = %ld max lines",max);
  pcVar5 = (char *)this->m_TestsDescription[0x15]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0x15),0,pcVar5,(ulong)__s);
  operator_delete__(__s);
  local_58 = (this->m_Buffer)._M_string_length;
  if (local_58 == 0) {
    bVar10 = true;
  }
  else {
    psVar1 = &this->m_Buffer;
    uVar8 = 1;
    bVar9 = 0;
    uVar6 = 0;
    uVar7 = 0;
    local_60 = this;
    do {
      std::__cxx11::string::find((char *)psVar1,0x16b512,uVar7 + 1);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
      uVar3 = uVar6 + 1;
      uVar6 = 0;
      if (local_48 < 2) {
        uVar6 = uVar3;
      }
      if (max < uVar6) {
        if (!checkEndOfFile) {
          lVar4 = std::__cxx11::string::find_first_not_of((char *)psVar1,0x178a24,uVar7);
          if (lVar4 == -1) goto LAB_00155be7;
        }
        paVar2 = &local_98.description.field_2;
        local_98.description._M_string_length = 0;
        local_98.description.field_2._M_local_buf[0] = '\0';
        local_98.number = 0x15;
        local_98.line = uVar8;
        local_98.line2 = uVar8;
        local_98.description._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_replace((ulong)&local_98.description,0,(char *)0x0,0x178a28);
        pcVar5 = (char *)operator_new__(10);
        snprintf(pcVar5,10,"%ld",uVar6);
        std::__cxx11::string::append((char *)&local_98.description);
        std::__cxx11::string::append((char *)&local_98.description);
        operator_delete__(pcVar5);
        pcVar5 = (char *)operator_new__(10);
        snprintf(pcVar5,10,"%ld",max);
        std::__cxx11::string::append((char *)&local_98.description);
        std::__cxx11::string::append((char *)&local_98.description);
        operator_delete__(pcVar5);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&local_60->m_ErrorList,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.description._M_dataplus._M_p != paVar2) {
          operator_delete(local_98.description._M_dataplus._M_p);
        }
        bVar9 = 1;
      }
LAB_00155be7:
      uVar3 = local_48;
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar7 = uVar7 + uVar3 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar7 < local_58);
    bVar10 = (bool)(bVar9 ^ 1);
  }
  return bVar10;
}

Assistant:

bool Parser::CheckEmptyLines(unsigned long max, bool checkEndOfFile)
{
  m_TestsDone[EMPTYLINES] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Empty lines = %ld max lines",max);
  m_TestsDescription[EMPTYLINES] = val;
  delete [] val;

  bool hasError = false;
  auto total = static_cast<unsigned long>(m_Buffer.size());
  unsigned long i = 0;
  unsigned long j = 1;
  unsigned long empty = 0;
  while(i<total)
    {
    // extract the line
    std::string line = m_Buffer.substr(i+1,m_Buffer.find("\n",i+1)-i-1);

    // if we have \n\r
    if(line.length() <= 1)
      {
      empty++;
      }
    else
      {
      empty = 0;
      }

    if(empty>max)
      {
      bool valid = true;
      // Check if we are at the end of the file
      if(!checkEndOfFile)
        {
        if(m_Buffer.find_first_not_of("\r\n ",i) == std::string::npos)
          {
          valid = false;
          }
        }

      if(valid)
        {
        Error error;
        error.line = j;
        error.line2 = error.line;
        error.number = EMPTYLINES;
        error.description = "Empty lines exceed ";
        constexpr size_t length = 10;
        char* localval = new char[length];
        snprintf(localval,length,"%ld",empty);
        error.description += localval;
        error.description += " (max=";
        delete [] localval;
        localval = new char[length];
        snprintf(localval,length,"%ld",max);
        error.description += localval;
        error.description += ")";
        delete [] localval;
        m_ErrorList.push_back(error);
        hasError = true;
        }
      }
    j++;
    i += static_cast<unsigned long>(line.length())+1;
    }
  return !hasError;
}